

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O3

WString * __thiscall
Jinx::Variant::GetWString_abi_cxx11_(WString *__return_storage_ptr__,Variant *this)

{
  String local_30;
  
  GetString_abi_cxx11_(&local_30,this);
  Impl::ConvertUtf8ToWString(__return_storage_ptr__,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    MemFree(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t WString Variant::GetWString() const
	{
		return Impl::ConvertUtf8ToWString(GetString());
	}